

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void __thiscall RtApiAlsa::callbackEvent(RtApiAlsa *this)

{
  ostringstream *poVar1;
  StreamMutex *__mutex;
  bool bVar2;
  StreamState SVar3;
  StreamMode SVar4;
  undefined8 *puVar5;
  code *pcVar6;
  RtAudioFormat RVar7;
  undefined8 uVar8;
  _func_int *p_Var9;
  undefined1 *puVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  long lVar16;
  size_t sVar17;
  ostream *poVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  RtAudioFormat *pRVar23;
  RtApiAlsa *this_00;
  RtApi *this_01;
  pthread_mutex_t *__mutex_00;
  undefined8 uStack_90;
  RtAudioFormat RStack_88;
  unsigned_long local_80;
  snd_pcm_sframes_t frames;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  RtAudioFormat local_50;
  pthread_mutex_t *local_48;
  char *local_40;
  int local_34;
  
  pRVar23 = &RStack_88;
  puVar5 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
  if ((this->super_RtApi).stream_.state == STREAM_STOPPED) {
    __mutex = &(this->super_RtApi).stream_.mutex;
    uStack_90 = 0x10e919;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (*(char *)(puVar5 + 9) == '\0') {
      do {
        uStack_90 = 0x10e92f;
        pthread_cond_wait((pthread_cond_t *)(puVar5 + 3),(pthread_mutex_t *)__mutex);
      } while (*(char *)(puVar5 + 9) != '\x01');
    }
    SVar3 = (this->super_RtApi).stream_.state;
    uStack_90 = 0x10e945;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (SVar3 != STREAM_RUNNING) {
      return;
    }
  }
  if ((this->super_RtApi).stream_.state == STREAM_CLOSED) {
    uStack_90 = 0x10e97a;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_RtApi).errorText_,0,
               (char *)(this->super_RtApi).errorText_._M_string_length,0x1160bf);
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    return;
  }
  pcVar6 = (code *)(this->super_RtApi).stream_.callbackInfo.callback;
  uStack_90 = 0x10e9a5;
  (*(this->super_RtApi)._vptr_RtApi[9])(this);
  SVar4 = (this->super_RtApi).stream_.mode;
  uVar19 = 0;
  if ((SVar4 != INPUT) && (*(char *)((long)puVar5 + 0x11) == '\x01')) {
    *(undefined1 *)((long)puVar5 + 0x11) = 0;
    uVar19 = 2;
  }
  if ((SVar4 != OUTPUT) && (*(char *)((long)puVar5 + 0x12) == '\x01')) {
    uVar19 = uVar19 | 1;
    *(undefined1 *)((long)puVar5 + 0x12) = 0;
  }
  uStack_90 = 0x10e9f4;
  iVar11 = (*pcVar6)((this->super_RtApi).stream_.userBuffer[0],
                     (this->super_RtApi).stream_.userBuffer[1],
                     (this->super_RtApi).stream_.bufferSize,uVar19,
                     (this->super_RtApi).stream_.callbackInfo.userData);
  if (iVar11 == 2) {
    (*(this->super_RtApi)._vptr_RtApi[8])(this);
    return;
  }
  __mutex_00 = (pthread_mutex_t *)&(this->super_RtApi).stream_.mutex;
  uStack_90 = 0x10ea22;
  this_00 = (RtApiAlsa *)__mutex_00;
  pthread_mutex_lock(__mutex_00);
  if ((this->super_RtApi).stream_.state == STREAM_STOPPED) goto LAB_0010efdf;
  pRVar23 = &RStack_88;
  local_48 = __mutex_00;
  local_34 = iVar11;
  if ((uint)((this->super_RtApi).stream_.mode + ~OUTPUT) < 2) {
    bVar2 = (this->super_RtApi).stream_.doConvertBuffer[1];
    pcVar15 = (this->super_RtApi).stream_.userBuffer[(ulong)bVar2 + 1];
    uVar19 = (this->super_RtApi).stream_.nUserChannels[(ulong)bVar2 * 2 + 1];
    RVar7 = (this->super_RtApi).stream_.deviceFormat[(ulong)bVar2 * 2 + -1];
    local_50 = RVar7;
    if ((this->super_RtApi).stream_.deviceInterleaved[1] == true) {
      this_01 = (RtApi *)puVar5[1];
      uStack_90 = 0x10ea89;
      iVar11 = snd_pcm_readi(this_01,pcVar15,(this->super_RtApi).stream_.bufferSize);
      pRVar23 = &RStack_88;
    }
    else {
      lVar16 = -((ulong)uVar19 * 8 + 0xf & 0xfffffffffffffff0);
      uVar13 = (this->super_RtApi).stream_.bufferSize;
      frames = (snd_pcm_sframes_t)&RStack_88;
      local_40 = pcVar15;
      *(undefined8 *)((long)&uStack_90 + lVar16) = 0x10eaba;
      uVar12 = RtApi::formatBytes(&this->super_RtApi,RVar7);
      if (0 < (int)uVar19) {
        uVar22 = 0;
        pcVar15 = local_40;
        do {
          *(char **)((long)&RStack_88 + lVar16 + uVar22 * 8) = pcVar15;
          uVar22 = uVar22 + 1;
          pcVar15 = pcVar15 + uVar12 * uVar13;
        } while (uVar19 != uVar22);
      }
      this_01 = (RtApi *)puVar5[1];
      uVar13 = (this->super_RtApi).stream_.bufferSize;
      *(undefined8 *)((long)&uStack_90 + lVar16) = 0x10eaea;
      iVar11 = snd_pcm_readn(this_01,(long)&RStack_88 + lVar16,uVar13);
      pRVar23 = (RtAudioFormat *)frames;
      pcVar15 = local_40;
    }
    RVar7 = local_50;
    uVar13 = (this->super_RtApi).stream_.bufferSize;
    if (iVar11 < (int)uVar13) {
      if (iVar11 == -0x20) {
        uVar8 = puVar5[1];
        *(undefined8 *)((long)pRVar23 + -8) = 0x10eb13;
        iVar11 = snd_pcm_state(uVar8);
        __mutex_00 = local_48;
        if (iVar11 == 4) {
          *(undefined1 *)((long)puVar5 + 0x12) = 1;
          uVar8 = puVar5[1];
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eb2e;
          iVar11 = snd_pcm_prepare(uVar8);
          if (-1 < iVar11) goto LAB_0010ec50;
          poVar18 = (ostream *)&(this->super_RtApi).errorStream_;
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eb51;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"RtApiAlsa::callbackEvent: error preparing device after overrun, ",0x40
                    );
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eb59;
          pcVar15 = (char *)snd_strerror(iVar11);
        }
        else {
          poVar1 = &(this->super_RtApi).errorStream_;
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eeab;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"RtApiAlsa::callbackEvent: error, current state is ",0x32);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eeb3;
          pcVar15 = (char *)snd_pcm_state_name(iVar11);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eebe;
          poVar18 = std::operator<<((ostream *)poVar1,pcVar15);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eed5;
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eedf;
          pcVar15 = (char *)snd_strerror(0xffffffe0);
        }
        *(undefined8 *)((long)pRVar23 + -8) = 0x10eeea;
        poVar18 = std::operator<<(poVar18,pcVar15);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10eefe;
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,".",1);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ef0e;
        std::__cxx11::stringbuf::str();
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ef1d;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,(string *)local_70);
        if (local_70[0] != local_60) {
LAB_0010ec4b:
          puVar10 = local_70[0];
          *(undefined8 *)((long)pRVar23 + -8) = 0x10ec50;
          operator_delete(puVar10);
        }
      }
      else {
        poVar1 = &(this->super_RtApi).errorStream_;
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ebf5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"RtApiAlsa::callbackEvent: audio read error, ",0x2c);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ebfd;
        pcVar15 = (char *)snd_strerror(iVar11);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec08;
        poVar18 = std::operator<<((ostream *)poVar1,pcVar15);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec1c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,".",1);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec2c;
        std::__cxx11::stringbuf::str();
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec3b;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,(string *)local_70);
        __mutex_00 = local_48;
        if (local_70[0] != local_60) goto LAB_0010ec4b;
      }
LAB_0010ec50:
      *(undefined8 *)((long)pRVar23 + -8) = 0x10ec5d;
      this_00 = this;
      RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    }
    else {
      if ((this->super_RtApi).stream_.doByteSwap[1] == true) {
        *(undefined8 *)((long)pRVar23 + -8) = 0x10eb7a;
        RtApi::byteSwapBuffer(this_01,pcVar15,uVar13 * uVar19,RVar7);
      }
      if ((this->super_RtApi).stream_.doConvertBuffer[1] == true) {
        pcVar15 = (this->super_RtApi).stream_.userBuffer[1];
        pcVar21 = (this->super_RtApi).stream_.deviceBuffer;
        *(undefined8 *)((long)pRVar23 + -8) = 0x10eba0;
        RtApi::convertBuffer
                  (&this->super_RtApi,pcVar15,pcVar21,(this->super_RtApi).stream_.convertInfo + 1);
      }
      this_00 = (RtApiAlsa *)puVar5[1];
      *(undefined8 *)((long)pRVar23 + -8) = 0x10ebb0;
      iVar11 = snd_pcm_delay(this_00,&local_80);
      __mutex_00 = local_48;
      if (0 < (long)local_80 && iVar11 == 0) {
        (this->super_RtApi).stream_.latency[1] = local_80;
      }
    }
  }
  iVar11 = local_34;
  if (((this->super_RtApi).stream_.mode & ~DUPLEX) != OUTPUT) goto LAB_0010efdf;
  if ((this->super_RtApi).stream_.doConvertBuffer[0] == true) {
    pcVar21 = (this->super_RtApi).stream_.userBuffer[0];
    pcVar15 = (this->super_RtApi).stream_.deviceBuffer;
    *(char *)((long)pRVar23 + -8) = -0x66;
    *(char *)((long)pRVar23 + -7) = -0x14;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    this_00 = this;
    RtApi::convertBuffer(&this->super_RtApi,pcVar15,pcVar21,(this->super_RtApi).stream_.convertInfo)
    ;
    lVar16 = 0x260;
    lVar20 = 0x234;
  }
  else {
    pcVar15 = (this->super_RtApi).stream_.userBuffer[0];
    lVar16 = 600;
    lVar20 = 0x22c;
  }
  uVar19 = *(uint *)((long)&(this->super_RtApi)._vptr_RtApi + lVar20);
  pcVar21 = *(char **)((long)&(this->super_RtApi)._vptr_RtApi + lVar16);
  if ((this->super_RtApi).stream_.doByteSwap[0] == true) {
    uVar13 = (this->super_RtApi).stream_.bufferSize;
    local_40 = pcVar21;
    *(char *)((long)pRVar23 + -8) = -0x1e;
    *(char *)((long)pRVar23 + -7) = -0x14;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    RtApi::byteSwapBuffer(&this_00->super_RtApi,pcVar15,uVar13 * uVar19,(RtAudioFormat)pcVar21);
    pcVar21 = local_40;
  }
  if ((this->super_RtApi).stream_.deviceInterleaved[0] == true) {
    uVar8 = *puVar5;
    uVar19 = (this->super_RtApi).stream_.bufferSize;
    *(char *)((long)pRVar23 + -8) = '\x01';
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar11 = snd_pcm_writei(uVar8,pcVar15,uVar19);
  }
  else {
    lVar16 = (long)pRVar23 - ((ulong)uVar19 * 8 + 0xf & 0xfffffffffffffff0);
    local_50 = CONCAT44(local_50._4_4_,(this->super_RtApi).stream_.bufferSize);
    local_40 = (char *)pRVar23;
    *(undefined8 *)(lVar16 + -8) = 0x10ed33;
    uVar13 = RtApi::formatBytes(&this->super_RtApi,(RtAudioFormat)pcVar21);
    if (0 < (int)uVar19) {
      uVar13 = uVar13 * (int)local_50;
      uVar22 = 0;
      do {
        *(char **)(lVar16 + uVar22 * 8) = pcVar15;
        uVar22 = uVar22 + 1;
        pcVar15 = pcVar15 + uVar13;
      } while (uVar19 != uVar22);
    }
    uVar8 = *puVar5;
    uVar19 = (this->super_RtApi).stream_.bufferSize;
    *(undefined8 *)(lVar16 + -8) = 0x10ed5f;
    iVar11 = snd_pcm_writen(uVar8,lVar16,uVar19);
    pRVar23 = (RtAudioFormat *)local_40;
  }
  __mutex_00 = local_48;
  if ((int)(this->super_RtApi).stream_.bufferSize <= iVar11) {
    uVar8 = *puVar5;
    *(char *)((long)pRVar23 + -8) = -0x37;
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar14 = snd_pcm_delay(uVar8,&local_80);
    iVar11 = local_34;
    if (0 < (long)local_80 && iVar14 == 0) {
      (this->super_RtApi).stream_.latency[0] = local_80;
    }
    goto LAB_0010efdf;
  }
  if (iVar11 == -0x20) {
    uVar8 = *puVar5;
    *(char *)((long)pRVar23 + -8) = -0x7e;
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar11 = snd_pcm_state(uVar8);
    if (iVar11 != 4) {
      poVar1 = &(this->super_RtApi).errorStream_;
      *(char *)((long)pRVar23 + -8) = 'T';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"RtApiAlsa::callbackEvent: error, current state is ",0x32);
      *(char *)((long)pRVar23 + -8) = '\\';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      pcVar15 = (char *)snd_pcm_state_name(iVar11);
      *(char *)((long)pRVar23 + -8) = 'g';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      poVar18 = std::operator<<((ostream *)poVar1,pcVar15);
      *(char *)((long)pRVar23 + -8) = '~';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
      *(char *)((long)pRVar23 + -8) = -0x78;
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      pcVar15 = (char *)snd_strerror(0xffffffe0);
LAB_0010ef82:
      *(char *)((long)pRVar23 + -8) = -0x76;
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      poVar18 = std::operator<<(poVar18,pcVar15);
      goto LAB_0010ef99;
    }
    *(undefined1 *)((long)puVar5 + 0x11) = 1;
    uVar8 = *puVar5;
    *(char *)((long)pRVar23 + -8) = -0x67;
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar11 = snd_pcm_prepare(uVar8);
    if (iVar11 < 0) {
      poVar18 = (ostream *)&(this->super_RtApi).errorStream_;
      *(char *)((long)pRVar23 + -8) = 'w';
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"RtApiAlsa::callbackEvent: error preparing device after underrun, ",0x41);
      *(char *)((long)pRVar23 + -8) = '\x7f';
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      pcVar15 = (char *)snd_strerror(iVar11);
      goto LAB_0010ef82;
    }
    *(char *)((long)pRVar23 + -8) = -0x4c;
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "RtApiAlsa::callbackEvent: audio write error, underrun.");
  }
  else {
    poVar18 = (ostream *)&(this->super_RtApi).errorStream_;
    *(char *)((long)pRVar23 + -8) = '\n';
    *(char *)((long)pRVar23 + -7) = -0x12;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"RtApiAlsa::callbackEvent: audio write error, ",0x2d);
    *(char *)((long)pRVar23 + -8) = '\x12';
    *(char *)((long)pRVar23 + -7) = -0x12;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    pcVar15 = (char *)snd_strerror(iVar11);
    if (pcVar15 == (char *)0x0) {
      uVar8 = *(undefined8 *)(*(long *)poVar18 + -0x18);
      *(char *)((long)pRVar23 + -8) = 'K';
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::ios::clear((int)poVar18 + (int)uVar8);
    }
    else {
      *(char *)((long)pRVar23 + -8) = '&';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      sVar17 = strlen(pcVar15);
      *(char *)((long)pRVar23 + -8) = '4';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar15,sVar17);
    }
LAB_0010ef99:
    *(char *)((long)pRVar23 + -8) = -0x62;
    *(char *)((long)pRVar23 + -7) = -0x11;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,".",1);
    *(char *)((long)pRVar23 + -8) = -0x52;
    *(char *)((long)pRVar23 + -7) = -0x11;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__cxx11::stringbuf::str();
    *(char *)((long)pRVar23 + -8) = -0x43;
    *(char *)((long)pRVar23 + -7) = -0x11;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,(string *)local_70);
    if (local_70[0] != local_60) {
      *(char *)((long)pRVar23 + -8) = -0x32;
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      operator_delete(local_70[0]);
    }
  }
  iVar11 = local_34;
  *(char *)((long)pRVar23 + -8) = -0x21;
  *(char *)((long)pRVar23 + -7) = -0x11;
  *(char *)((long)pRVar23 + -6) = '\x10';
  *(char *)((long)pRVar23 + -5) = '\0';
  *(char *)((long)pRVar23 + -4) = '\0';
  *(char *)((long)pRVar23 + -3) = '\0';
  *(char *)((long)pRVar23 + -2) = '\0';
  *(char *)((long)pRVar23 + -1) = '\0';
  RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
LAB_0010efdf:
  *(undefined8 *)((long)pRVar23 + -8) = 0x10efe7;
  pthread_mutex_unlock(__mutex_00);
  (this->super_RtApi).stream_.streamTime =
       (double)(this->super_RtApi).stream_.bufferSize /
       (double)(this->super_RtApi).stream_.sampleRate + (this->super_RtApi).stream_.streamTime;
  if (iVar11 == 1) {
    p_Var9 = (this->super_RtApi)._vptr_RtApi[7];
    *(undefined8 *)((long)pRVar23 + -8) = 0x10f023;
    (*p_Var9)(this);
  }
  return;
}

Assistant:

void RtApiAlsa :: callbackEvent()
{
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  if ( stream_.state == STREAM_STOPPED ) {
    MUTEX_LOCK( &stream_.mutex );
    while ( !apiInfo->runnable )
      pthread_cond_wait( &apiInfo->runnable_cv, &stream_.mutex );

    if ( stream_.state != STREAM_RUNNING ) {
      MUTEX_UNLOCK( &stream_.mutex );
      return;
    }
    MUTEX_UNLOCK( &stream_.mutex );
  }

  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiAlsa::callbackEvent(): the stream is closed ... this shouldn't happen!";
    error( RTAUDIO_WARNING );
    return;
  }

  int doStopStream = 0;
  RtAudioCallback callback = (RtAudioCallback) stream_.callbackInfo.callback;
  double streamTime = getStreamTime();
  RtAudioStreamStatus status = 0;
  if ( stream_.mode != INPUT && apiInfo->xrun[0] == true ) {
    status |= RTAUDIO_OUTPUT_UNDERFLOW;
    apiInfo->xrun[0] = false;
  }
  if ( stream_.mode != OUTPUT && apiInfo->xrun[1] == true ) {
    status |= RTAUDIO_INPUT_OVERFLOW;
    apiInfo->xrun[1] = false;
  }
  doStopStream = callback( stream_.userBuffer[0], stream_.userBuffer[1],
                           stream_.bufferSize, streamTime, status, stream_.callbackInfo.userData );

  if ( doStopStream == 2 ) {
    abortStream();
    return;
  }

  MUTEX_LOCK( &stream_.mutex );

  // The state might change while waiting on a mutex.
  if ( stream_.state == STREAM_STOPPED ) goto unlock;

  int result;
  char *buffer;
  int channels;
  snd_pcm_t **handle;
  snd_pcm_sframes_t frames;
  RtAudioFormat format;
  handle = (snd_pcm_t **) apiInfo->handles;

  if ( stream_.mode == INPUT || stream_.mode == DUPLEX ) {

    // Setup parameters.
    if ( stream_.doConvertBuffer[1] ) {
      buffer = stream_.deviceBuffer;
      channels = stream_.nDeviceChannels[1];
      format = stream_.deviceFormat[1];
    }
    else {
      buffer = stream_.userBuffer[1];
      channels = stream_.nUserChannels[1];
      format = stream_.userFormat;
    }

    // Read samples from device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[1] )
      result = snd_pcm_readi( handle[1], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_readn( handle[1], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or overrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[1] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[1] = true;
          result = snd_pcm_prepare( handle[1] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after overrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio read error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto tryOutput;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[1] )
      byteSwapBuffer( buffer, stream_.bufferSize * channels, format );

    // Do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[1] )
      convertBuffer( stream_.userBuffer[1], stream_.deviceBuffer, stream_.convertInfo[1] );

    // Check stream latency
    result = snd_pcm_delay( handle[1], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[1] = frames;
  }

 tryOutput:

  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {

    // Setup parameters and do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[0] ) {
      buffer = stream_.deviceBuffer;
      convertBuffer( buffer, stream_.userBuffer[0], stream_.convertInfo[0] );
      channels = stream_.nDeviceChannels[0];
      format = stream_.deviceFormat[0];
    }
    else {
      buffer = stream_.userBuffer[0];
      channels = stream_.nUserChannels[0];
      format = stream_.userFormat;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[0] )
      byteSwapBuffer(buffer, stream_.bufferSize * channels, format);

    // Write samples to device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[0] )
      result = snd_pcm_writei( handle[0], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_writen( handle[0], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or underrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[0] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[0] = true;
          result = snd_pcm_prepare( handle[0] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after underrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
          else
            errorText_ =  "RtApiAlsa::callbackEvent: audio write error, underrun.";
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio write error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto unlock;
    }

    // Check stream latency
    result = snd_pcm_delay( handle[0], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[0] = frames;
  }

 unlock:
  MUTEX_UNLOCK( &stream_.mutex );

  RtApi::tickStreamTime();
  if ( doStopStream == 1 ) this->stopStream();
}